

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

CURLcode imap_state_auth_cancel_resp(connectdata *conn,int imapcode,imapstate instate)

{
  imapstate local_50;
  imapstate local_4c;
  imapstate state2;
  imapstate state1;
  size_t len;
  char *initresp;
  char *mech;
  imap_conn *imapc;
  SessionHandle *data;
  imapstate local_18;
  CURLcode result;
  imapstate instate_local;
  int imapcode_local;
  connectdata *conn_local;
  
  data._4_4_ = 0;
  imapc = (imap_conn *)conn->data;
  mech = (char *)&conn->proto;
  initresp = (char *)0x0;
  len = 0;
  _state2 = 0;
  local_4c = IMAP_STOP;
  local_50 = IMAP_STOP;
  (conn->proto).imapc.authmechs = (conn->proto).imapc.authused ^ (conn->proto).imapc.authmechs;
  local_18 = instate;
  result = imapcode;
  _instate_local = conn;
  data._4_4_ = imap_calc_sasl_details
                         (conn,&initresp,(char **)&len,(size_t *)&state2,&local_4c,&local_50);
  if (data._4_4_ == CURLE_OK) {
    if (initresp == (char *)0x0) {
      if (((mech[0x92] & 1U) == 0) && ((*(uint *)(mech + 0x7c) & 1) != 0)) {
        data._4_4_ = imap_perform_login(_instate_local);
      }
      else {
        Curl_failf((SessionHandle *)imapc,"Authentication cancelled");
        data._4_4_ = CURLE_LOGIN_DENIED;
      }
    }
    else {
      data._4_4_ = imap_perform_authenticate(_instate_local,initresp,(char *)len,local_4c,local_50);
      if (len != 0) {
        (*Curl_cfree)((void *)len);
      }
    }
  }
  return data._4_4_;
}

Assistant:

static CURLcode imap_state_auth_cancel_resp(struct connectdata *conn,
                                            int imapcode,
                                            imapstate instate)
{
  CURLcode result = CURLE_OK;
  struct SessionHandle *data = conn->data;
  struct imap_conn *imapc = &conn->proto.imapc;
  const char *mech = NULL;
  char *initresp = NULL;
  size_t len = 0;
  imapstate state1 = IMAP_STOP;
  imapstate state2 = IMAP_STOP;

  (void)imapcode;
  (void)instate; /* no use for this yet */

  /* Remove the offending mechanism from the supported list */
  imapc->authmechs ^= imapc->authused;

  /* Calculate alternative SASL login details */
  result = imap_calc_sasl_details(conn, &mech, &initresp, &len, &state1,
                                  &state2);

  if(!result) {
    /* Do we have any mechanisms left or can we fallback to clear text? */
    if(mech) {
      /* Retry SASL based authentication */
      result = imap_perform_authenticate(conn, mech, initresp, state1, state2);

      Curl_safefree(initresp);
    }
    else if((!imapc->login_disabled) &&
            (imapc->preftype & IMAP_TYPE_CLEARTEXT))
      /* Perform clear text authentication */
      result = imap_perform_login(conn);
    else {
      failf(data, "Authentication cancelled");

      result = CURLE_LOGIN_DENIED;
    }
  }

  return result;
}